

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t coda_revnspc(char *s,char *n,size_t len)

{
  char cVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  
  lVar2 = len - 1;
  lVar5 = lVar2;
  lVar3 = -1;
  if (lVar2 < -1) {
    lVar3 = lVar2;
  }
  for (; lVar4 = lVar3, pcVar6 = n, -1 < lVar5; lVar5 = lVar5 + -1) {
    while (cVar1 = *pcVar6, cVar1 != '\0') {
      lVar4 = lVar5;
      pcVar6 = pcVar6 + 1;
      if (s[lVar5] == cVar1) goto LAB_00106420;
    }
  }
LAB_00106420:
  return lVar2 - lVar4;
}

Assistant:

size_t coda_revnspc(const char *s, const char *n, size_t len)
{
	const char *b = s - 1;
	const char *p = s - 1 + len;
	const char *x;

	for (; p > b; --p)
	{
		for (x = n; *x; ++x)
		{
			if (*p == *x) return s - 1 + len - p;
		}
	}

	return s - 1 + len - p;
}